

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void __thiscall capnp::_::PointerBuilder::setBlob<capnp::Data>(PointerBuilder *this,Reader value)

{
  undefined1 auVar1 [16];
  ulong in_stack_ffffffffffffffb0;
  SegmentAnd<capnp::Data::Builder> local_48;
  PointerBuilder *local_30;
  BuilderArena *local_28;
  PointerBuilder *local_20;
  PointerBuilder *this_local;
  Reader value_local;
  
  local_28 = (BuilderArena *)value.super_ArrayPtr<const_unsigned_char>.size_;
  local_30 = (PointerBuilder *)value.super_ArrayPtr<const_unsigned_char>.ptr;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_stack_ffffffffffffffb0;
  local_20 = this;
  this_local = local_30;
  value_local.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)local_28;
  WireHelpers::setDataPointer
            (&local_48,(WireHelpers *)this->pointer,(WirePointer *)this->segment,
             (SegmentBuilder *)this->capTable,(CapTableBuilder *)local_30,(Reader)(auVar1 << 0x40),
             local_28);
  return;
}

Assistant:

void PointerBuilder::setBlob<Data>(Data::Reader value) {
  WireHelpers::setDataPointer(pointer, segment, capTable, value);
}